

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  Char CVar4;
  ScriptConfiguration *pSVar5;
  undefined4 *puVar6;
  codepoint_t local_44;
  char16 local_36;
  char16 local_34;
  char16 local_32;
  Char local_30;
  char16 ignore;
  char16 rightSingleChar;
  char16 leftSingleChar;
  Char outChar;
  bool previousSurrogatePart;
  codepoint_t pendingRangeEnd;
  codepoint_t pendingRangeStart;
  codepoint_t lastCodepoint;
  EncodedChar *current;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPStack_10;
  EncodedChar nextChar;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  pPStack_10 = this;
  EVar3 = ECLookahead(this,0);
  if (EVar3 == L'^') {
    ECConsume(this,1);
  }
  current._6_2_ = ECLookahead(this,0);
  pendingRangeEnd = 0xffffffff;
  _outChar = 0xffffffff;
  _rightSingleChar = 0xffffffff;
  ignore._1_1_ = 0;
  while( true ) {
    if (current._6_2_ == L']') {
      if (_rightSingleChar != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x83a,"(pendingRangeEnd == INVALID_CODEPOINT)",
                           "pendingRangeEnd == INVALID_CODEPOINT");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return;
    }
    _pendingRangeStart = this->next;
    if ((current._6_2_ == L'\0') && (bVar2 = IsEOF(this), bVar2)) break;
    if (current._6_2_ == L'\\') {
      local_30 = NextChar(this);
      bVar2 = ClassEscapePass0(this,&local_30,(bool *)((long)&ignore + 1));
      if (bVar2) {
        pendingRangeEnd = (codepoint_t)(ushort)local_30;
      }
      else {
        pendingRangeEnd = 0xffffffff;
        if (_rightSingleChar == 0xffffffff) {
          _outChar = 0xffffffff;
        }
      }
    }
    else if (current._6_2_ == L'-') {
      if ((_outChar == 0xffffffff) && (pendingRangeEnd != 0xffffffff)) {
        if (this->next == this->positionAfterLastSurrogate) {
          local_44 = this->valueOfLastSurrogate;
        }
        else {
          local_44 = pendingRangeEnd;
        }
        _outChar = local_44;
        pendingRangeEnd = 0xffffffff;
        NextChar(this);
      }
      else {
        CVar4 = NextChar(this);
        pendingRangeEnd = (codepoint_t)(ushort)CVar4;
      }
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      if ((ignore._1_1_ & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x7d6,"(!previousSurrogatePart)","!previousSurrogatePart");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    else {
      CVar4 = NextChar(this);
      pendingRangeEnd = (codepoint_t)(ushort)CVar4;
      pSVar5 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar5);
      if (bVar2) {
        TrackIfSurrogatePair
                  (this,pendingRangeEnd,_pendingRangeStart,
                   (uint32)((long)this->next - (long)_pendingRangeStart >> 1));
      }
    }
    pSVar5 = Js::ScriptContext::GetConfig(this->scriptContext);
    bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar5);
    if (bVar2) {
      if ((_outChar != 0xffffffff) &&
         ((pendingRangeEnd != 0xffffffff || (_rightSingleChar != 0xffffffff)))) {
        if (this->next == this->positionAfterLastSurrogate) {
          pendingRangeEnd = this->valueOfLastSurrogate;
          if ((ignore._1_1_ & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7f8,"(!previousSurrogatePart)","!previousSurrogatePart");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          _rightSingleChar = pendingRangeEnd;
          pendingRangeEnd = 0xffffffff;
        }
        else {
          EVar3 = ECLookahead(this,0);
          if ((EVar3 == L']') && (_rightSingleChar == 0xffffffff)) {
            _rightSingleChar = pendingRangeEnd;
          }
        }
        if (_rightSingleChar == 0xffffffff) {
          _rightSingleChar = pendingRangeEnd;
        }
        else {
          if (_outChar < 0x10000) {
            local_32 = (char16)_outChar;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(_outChar,&local_36,&local_32);
          }
          if (_rightSingleChar < 0x10000) {
            local_34 = (char16)_rightSingleChar;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(_rightSingleChar,&local_34,&local_36);
          }
          if (((_outChar < 0x10000) && (_rightSingleChar < 0x10000)) &&
             (_rightSingleChar < _outChar)) {
            Fail(this,-0x7ff5ec63);
          }
          else {
            if ((ushort)local_34 < (ushort)local_32) {
              DeferredFailIfNotUnicode(this,-0x7ff5ec63);
            }
            if (_rightSingleChar < _outChar) {
              DeferredFailIfUnicode(this,-0x7ff5ec63);
            }
          }
          _rightSingleChar = 0xffffffff;
          _outChar = 0xffffffff;
        }
      }
    }
    else if ((_outChar != 0xffffffff) && (pendingRangeEnd != 0xffffffff)) {
      if (0xffff < _outChar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x7e7,"(pendingRangeStart < 0x10000)","pendingRangeStart < 0x10000");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (_rightSingleChar != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x7e8,"(pendingRangeEnd == INVALID_CODEPOINT)",
                           "pendingRangeEnd == INVALID_CODEPOINT");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (pendingRangeEnd < _outChar) {
        Fail(this,-0x7ff5ec63);
      }
      pendingRangeEnd = 0xffffffff;
      _outChar = 0xffffffff;
    }
    current._6_2_ = ECLookahead(this,0);
  }
  Fail(this,-0x7ff5ec65);
  return;
}

Assistant:

void Parser<P, IsLiteral>::CharacterClassPass0()
    {
        // Could be terminating 0
        if (ECLookahead() == '^')
            ECConsume();

        EncodedChar nextChar = ECLookahead();
        const EncodedChar* current;
        codepoint_t lastCodepoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        codepoint_t pendingRangeEnd = INVALID_CODEPOINT;
        bool previousSurrogatePart = false;

        while(nextChar != ']')
        {
            current = next;

            if (nextChar == '\0' && IsEOF())
            {
                // Report as unclosed '['
                Fail(JSERR_RegExpNoBracket);
                return;
            } // Otherwise embedded '\0' is ok
            else if (nextChar == '\\')
            {
                // Consume, as classescapepass0 expects for it to be consumed
                Char outChar = NextChar();
                // If previousSurrogatePart = true upon leaving this method, then we are going to pass through here twice
                // This is because \u{} escape sequence was encountered that is actually 2 characters, the second time we will pass consuming entire character
                if (ClassEscapePass0(outChar, previousSurrogatePart))
                {
                    lastCodepoint = outChar;
                }
                else
                {
                    // Last codepoint isn't a singleton, so no codepoint tracking for the sake of ranges is needed.
                    lastCodepoint = INVALID_CODEPOINT;
                    // Unless we have a possible range end, cancel our range tracking.
                    if (pendingRangeEnd == INVALID_CODEPOINT)
                    {
                        pendingRangeStart = INVALID_CODEPOINT;
                    }
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || lastCodepoint == INVALID_CODEPOINT)
                {
                    // '-' is the upper part of the range, with pendingRangeStart codepoint is the lower. Set  lastCodePoint to '-' to check at the end of the while statement
                    // OR
                    // '-' is just a char, consume it and set as last char
                    lastCodepoint = NextChar();
                }
                else
                {
                    pendingRangeStart = this->next == this->positionAfterLastSurrogate
                        ? this->valueOfLastSurrogate
                        : lastCodepoint;
                    lastCodepoint = INVALID_CODEPOINT;
                    NextChar();
                }

                // If we have a pattern of the form [\ud800-\udfff], we need this to be interpreted as a range.
                // In order to achieve this, the two variables that we use to track surrogate pairs, namely
                // tempLocationOfSurrogatePair and previousSurrogatePart, need to be in a certain state.
                //
                // We need to reset tempLocationOfSurrogatePair as it points to the first Unicode escape (\ud800)
                // when we're here. We need to clear it in order not to have a surrogate pair when we process the
                // second escape (\udfff).
                //
                // previousSurrogatePart is used when we have a code point in the \u{...} extended format and the
                // character is in a supplementary plane. However, there is no need to change its value here. When
                // such an escape sequence is encountered, the first call to ClassEscapePass0() sets the variable
                // to true, but it rewinds the input back to the beginning of the escape sequence. The next
                // iteration of the loop here will again call ClassEscape0() with the same character and the
                // variable will this time be set to false. Therefore, the variable will always be false here.
                tempLocationOfSurrogatePair = nullptr;
                Assert(!previousSurrogatePart);
            }
            else
            {
                lastCodepoint = NextChar();

                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(lastCodepoint, current, (uint32)(next - current));
                }
            }

            if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
            {
                // This is much easier to handle.
                if (pendingRangeStart != INVALID_CODEPOINT && lastCodepoint != INVALID_CODEPOINT)
                {
                    Assert(pendingRangeStart < 0x10000);
                    Assert(pendingRangeEnd == INVALID_CODEPOINT);
                    if (pendingRangeStart > lastCodepoint)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    pendingRangeStart = lastCodepoint = INVALID_CODEPOINT;
                }
            }
            // We have a candidate for range end, and we have a range start.
            else if (pendingRangeStart != INVALID_CODEPOINT && (lastCodepoint != INVALID_CODEPOINT || pendingRangeEnd != INVALID_CODEPOINT))
            {
                // The following will be true at the end of each surrogate pair parse.
                // Note, the escape sequence \u{} is a two time parse, so this will be true on the second time around.
                if (this->next == this->positionAfterLastSurrogate)
                {
                    lastCodepoint = this->valueOfLastSurrogate;
                    Assert(!previousSurrogatePart);
                    pendingRangeEnd = lastCodepoint;

                    lastCodepoint = INVALID_CODEPOINT;
                }
                // If the next character is the end of range ']', then we can't have a surrogate pair.
                // The current character is the range end, if we don't already have a candidate.
                else if (ECLookahead() == ']' && pendingRangeEnd == INVALID_CODEPOINT)
                {
                    pendingRangeEnd = lastCodepoint;
                }

                //If we get here, and pendingRangeEnd is set. Then one of the above has caused it to be set, or the previous iteration of the loop.
                if (pendingRangeEnd != INVALID_CODEPOINT)
                {
                    char16 leftSingleChar, rightSingleChar, ignore;

                    if (pendingRangeStart >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeStart, &ignore, &leftSingleChar);
                    }
                    else
                    {
                        leftSingleChar = (char16)pendingRangeStart;
                    }

                    if (pendingRangeEnd >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeEnd, &rightSingleChar, &ignore);
                    }
                    else
                    {
                        rightSingleChar = (char16)pendingRangeEnd;
                    }

                    // Here it is a bit tricky, we don't know if we have a unicode option specified.
                    // If it is, then \ud800\udc00 - \ud800\udc01 is valid, otherwise invalid.
                    if (pendingRangeStart < 0x10000 && pendingRangeEnd < 0x10000 && pendingRangeStart > pendingRangeEnd)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    else
                    {
                        if(leftSingleChar > rightSingleChar)
                        {
                            DeferredFailIfNotUnicode(JSERR_RegExpBadRange);
                        }

                        if (pendingRangeStart > pendingRangeEnd)
                        {
                            DeferredFailIfUnicode(JSERR_RegExpBadRange);
                        }
                    }

                    pendingRangeStart = pendingRangeEnd = INVALID_CODEPOINT;
                }
                // The current char < 0x10000 is a candidate for the range end, but we need to iterate one more time.
                else
                {
                    pendingRangeEnd = lastCodepoint;
                }
            }
            nextChar = ECLookahead();
        }

        // We should never have a pendingRangeEnd set when we exit the loop
        Assert(pendingRangeEnd == INVALID_CODEPOINT);
    }